

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRWithLayer(float **out_rgba,int *width,int *height,char *filename,char *layername,
                    char **err)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  size_type local_638;
  ulong local_628;
  size_t i_4;
  size_t pixel_size_1;
  uchar **src_1;
  size_t srcIdx_1;
  size_t idx_1;
  size_t jj_1;
  size_t ii_1;
  size_t i_3;
  size_t j_1;
  int it_1;
  size_t tile_size_y_1;
  size_t tile_size_x_1;
  string local_5c0;
  allocator local_599;
  string local_598;
  allocator local_571;
  string local_570;
  float local_54c;
  ulong uStack_548;
  float val;
  size_t i_2;
  size_t pixel_size;
  uchar **src;
  size_t srcIdx;
  size_t idx;
  size_t jj;
  size_t ii;
  size_t i_1;
  size_t j;
  ulong uStack_4f8;
  int it;
  size_t tile_size_y;
  size_t tile_size_x;
  reference pvStack_4e0;
  int chIdx;
  LayerChannel *ch;
  size_t c;
  size_t ch_count;
  string local_4c0;
  allocator local_499;
  string local_498;
  byte local_474;
  allocator local_473;
  byte local_472;
  allocator local_471;
  string local_470;
  undefined1 local_450 [8];
  vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> channels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_names;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret_2;
  int i;
  int ret_1;
  string local_3e0;
  stringstream local_3c0 [8];
  stringstream ss;
  ostream aoStack_3b0 [380];
  int local_234;
  undefined1 local_230 [4];
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  char **err_local;
  char *layername_local;
  char *filename_local;
  int *height_local;
  int *width_local;
  float **out_rgba_local;
  
  if (out_rgba == (float **)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&exr_version.multipart,"Invalid argument for LoadEXR()",
               (allocator *)((long)&exr_version.non_image + 3));
    tinyexr::SetErrorMessage((string *)&exr_version.multipart,err);
    std::__cxx11::string::~string((string *)&exr_version.multipart);
    std::allocator<char>::~allocator((allocator<char> *)((long)&exr_version.non_image + 3));
    return -3;
  }
  InitEXRHeader((EXRHeader *)local_230);
  InitEXRImage((EXRImage *)(exr_header.name + 0xf8));
  local_234 = ParseEXRVersionFromFile((EXRVersion *)&exr_image.num_channels,filename);
  if (local_234 != 0) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    poVar4 = std::operator<<(aoStack_3b0,
                             "Failed to open EXR file or read version info from EXR file. code(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_234);
    std::operator<<(poVar4,")");
    std::__cxx11::stringstream::str();
    tinyexr::SetErrorMessage(&local_3e0,err);
    std::__cxx11::string::~string((string *)&local_3e0);
    iVar3 = local_234;
    std::__cxx11::stringstream::~stringstream(local_3c0);
    return iVar3;
  }
  if ((exr_version.long_name != 0) || (exr_version.tiled != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&ret_1,"Loading multipart or DeepImage is not supported  in LoadEXR() API",
               (allocator *)((long)&i + 3));
    tinyexr::SetErrorMessage((string *)&ret_1,err);
    std::__cxx11::string::~string((string *)&ret_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    return -4;
  }
  iVar3 = ParseEXRHeaderFromFile
                    ((EXRHeader *)local_230,(EXRVersion *)&exr_image.num_channels,filename,err);
  if (iVar3 != 0) {
    FreeEXRHeader((EXRHeader *)local_230);
    return iVar3;
  }
  for (idxR = 0; idxR < (int)exr_header.pixel_types; idxR = idxR + 1) {
    if (*(int *)((exr_header.channels)->name + (long)idxR * 4) == 1) {
      *(undefined4 *)(exr_header._120_8_ + (long)idxR * 4) = 2;
    }
  }
  iVar3 = LoadEXRImageFromFile
                    ((EXRImage *)(exr_header.name + 0xf8),(EXRHeader *)local_230,filename,err);
  if (iVar3 != 0) {
    FreeEXRHeader((EXRHeader *)local_230);
    return iVar3;
  }
  idxB = -1;
  idxA = -1;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
  layer_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&channels.
               super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyexr::GetLayers((EXRHeader *)local_230,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&channels.
                         super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::vector
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)local_450);
  local_472 = 0;
  local_474 = 0;
  if (layername == (char *)0x0) {
    std::allocator<char>::allocator();
    local_472 = 1;
    std::__cxx11::string::string((string *)&local_470,"",&local_471);
  }
  else {
    std::allocator<char>::allocator();
    local_474 = 1;
    std::__cxx11::string::string((string *)&local_470,layername,&local_473);
  }
  tinyexr::ChannelsInLayer
            ((EXRHeader *)local_230,&local_470,
             (vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)local_450);
  std::__cxx11::string::~string((string *)&local_470);
  if ((local_474 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_473);
  }
  if ((local_472 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
  }
  sVar5 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                     local_450);
  if (sVar5 == 0) {
    if (layername == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_498,
                 "Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer."
                 ,&local_499);
      tinyexr::SetErrorMessage(&local_498,err);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4c0,"Layer Not Found",(allocator *)((long)&ch_count + 7));
      tinyexr::SetErrorMessage(&local_4c0,err);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ch_count + 7));
    }
    FreeEXRHeader((EXRHeader *)local_230);
    FreeEXRImage((EXRImage *)(exr_header.name + 0xf8));
    out_rgba_local._4_4_ = -0xd;
    goto LAB_0098c901;
  }
  sVar5 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                     local_450);
  if (sVar5 < 4) {
    local_638 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                          ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                           local_450);
  }
  else {
    local_638 = 4;
  }
  c = local_638;
  for (ch = (LayerChannel *)0x0; ch < c; ch = (LayerChannel *)((long)&ch->index + 1)) {
    pvStack_4e0 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::
                  operator[]((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>
                              *)local_450,(size_type)ch);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pvStack_4e0->name,"R");
    if (bVar2) {
      idxB = (int)pvStack_4e0->index;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &pvStack_4e0->name,"G");
      if (bVar2) {
        idxA = (int)pvStack_4e0->index;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&pvStack_4e0->name,"B");
        if (bVar2) {
          layer_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)pvStack_4e0->index;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&pvStack_4e0->name,"A");
          if (bVar2) {
            layer_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)pvStack_4e0->index;
          }
        }
      }
    }
  }
  sVar5 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::size
                    ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                     local_450);
  if (sVar5 == 1) {
    pvVar6 = std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::front
                       ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)
                        local_450);
    tile_size_x._4_4_ = (int)pvVar6->index;
    pfVar7 = (float *)malloc((long)(int)exr_image.images * 0x10 * (long)exr_image.images._4_4_);
    *out_rgba = pfVar7;
    if (exr_header.screen_window_width == 0.0) {
      i_2 = (long)(int)exr_image.images * (long)exr_image.images._4_4_;
      for (uStack_548 = 0; uStack_548 < i_2; uStack_548 = uStack_548 + 1) {
        local_54c = *(float *)(*(long *)(exr_image._16_8_ + (long)tile_size_x._4_4_ * 8) +
                              uStack_548 * 4);
        (*out_rgba)[uStack_548 * 4] = local_54c;
        (*out_rgba)[uStack_548 * 4 + 1] = local_54c;
        (*out_rgba)[uStack_548 * 4 + 2] = local_54c;
        (*out_rgba)[uStack_548 * 4 + 3] = local_54c;
      }
    }
    else {
      tile_size_y = (size_t)exr_header.chunk_count;
      uStack_4f8 = (ulong)exr_header.tiled;
      for (j._4_4_ = 0; j._4_4_ < exr_image.height; j._4_4_ = j._4_4_ + 1) {
        for (i_1 = 0; i_1 < uStack_4f8; i_1 = i_1 + 1) {
          for (ii = 0; ii < tile_size_y; ii = ii + 1) {
            jj = (long)*(int *)(exr_header.name._248_8_ + (long)j._4_4_ * 0x20) * tile_size_y + ii;
            idx = (long)*(int *)(exr_header.name._248_8_ + (long)j._4_4_ * 0x20 + 4) * uStack_4f8 +
                  i_1;
            srcIdx = jj + idx * (long)(int)exr_image.images;
            if ((jj < (ulong)(long)(int)exr_image.images) &&
               (idx < (ulong)(long)exr_image.images._4_4_)) {
              src = (uchar **)(ii + i_1 * tile_size_y);
              pixel_size = *(size_t *)(exr_header.name._248_8_ + (long)j._4_4_ * 0x20 + 0x18);
              (*out_rgba)[srcIdx * 4] =
                   *(float *)(*(long *)(pixel_size + (long)tile_size_x._4_4_ * 8) + (long)src * 4);
              (*out_rgba)[srcIdx * 4 + 1] =
                   *(float *)(*(long *)(pixel_size + (long)tile_size_x._4_4_ * 8) + (long)src * 4);
              (*out_rgba)[srcIdx * 4 + 2] =
                   *(float *)(*(long *)(pixel_size + (long)tile_size_x._4_4_ * 8) + (long)src * 4);
              (*out_rgba)[srcIdx * 4 + 3] =
                   *(float *)(*(long *)(pixel_size + (long)tile_size_x._4_4_ * 8) + (long)src * 4);
            }
          }
        }
      }
    }
  }
  else {
    if (idxB == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_570,"R channel not found",&local_571);
      tinyexr::SetErrorMessage(&local_570,err);
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator((allocator<char> *)&local_571);
      FreeEXRHeader((EXRHeader *)local_230);
      FreeEXRImage((EXRImage *)(exr_header.name + 0xf8));
      out_rgba_local._4_4_ = -4;
      goto LAB_0098c901;
    }
    if (idxA == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_598,"G channel not found",&local_599);
      tinyexr::SetErrorMessage(&local_598,err);
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator((allocator<char> *)&local_599);
      FreeEXRHeader((EXRHeader *)local_230);
      FreeEXRImage((EXRImage *)(exr_header.name + 0xf8));
      out_rgba_local._4_4_ = -4;
      goto LAB_0098c901;
    }
    if (layer_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5c0,"B channel not found",(allocator *)((long)&tile_size_x_1 + 7))
      ;
      tinyexr::SetErrorMessage(&local_5c0,err);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tile_size_x_1 + 7));
      FreeEXRHeader((EXRHeader *)local_230);
      FreeEXRImage((EXRImage *)(exr_header.name + 0xf8));
      out_rgba_local._4_4_ = -4;
      goto LAB_0098c901;
    }
    pfVar7 = (float *)malloc((long)(int)exr_image.images * 0x10 * (long)exr_image.images._4_4_);
    *out_rgba = pfVar7;
    if (exr_header.screen_window_width == 0.0) {
      for (local_628 = 0;
          local_628 < (ulong)((long)(int)exr_image.images * (long)exr_image.images._4_4_);
          local_628 = local_628 + 1) {
        (*out_rgba)[local_628 * 4] =
             *(float *)(*(long *)(exr_image._16_8_ + (long)idxB * 8) + local_628 * 4);
        (*out_rgba)[local_628 * 4 + 1] =
             *(float *)(*(long *)(exr_image._16_8_ + (long)idxA * 8) + local_628 * 4);
        (*out_rgba)[local_628 * 4 + 2] =
             *(float *)(*(long *)(exr_image._16_8_ +
                                 (long)layer_names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 8)
                       + local_628 * 4);
        if ((int)layer_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage == -1) {
          (*out_rgba)[local_628 * 4 + 3] = 1.0;
        }
        else {
          (*out_rgba)[local_628 * 4 + 3] =
               *(float *)(*(long *)(exr_image._16_8_ +
                                   (long)(int)layer_names.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage * 8
                                   ) + local_628 * 4);
        }
      }
    }
    else {
      uVar8 = (ulong)exr_header.chunk_count;
      for (j_1._4_4_ = 0; j_1._4_4_ < exr_image.height; j_1._4_4_ = j_1._4_4_ + 1) {
        for (i_3 = 0; i_3 < (ulong)(long)exr_header.tiled; i_3 = i_3 + 1) {
          for (ii_1 = 0; ii_1 < uVar8; ii_1 = ii_1 + 1) {
            uVar9 = (long)*(int *)(exr_header.name._248_8_ + (long)j_1._4_4_ * 0x20) * uVar8 + ii_1;
            uVar10 = (long)*(int *)(exr_header.name._248_8_ + (long)j_1._4_4_ * 0x20 + 4) *
                     (long)exr_header.tiled + i_3;
            lVar11 = uVar9 + uVar10 * (long)(int)exr_image.images;
            if ((uVar9 < (ulong)(long)(int)exr_image.images) &&
               (uVar10 < (ulong)(long)exr_image.images._4_4_)) {
              lVar12 = ii_1 + i_3 * uVar8;
              lVar1 = *(long *)(exr_header.name._248_8_ + (long)j_1._4_4_ * 0x20 + 0x18);
              (*out_rgba)[lVar11 * 4] = *(float *)(*(long *)(lVar1 + (long)idxB * 8) + lVar12 * 4);
              (*out_rgba)[lVar11 * 4 + 1] =
                   *(float *)(*(long *)(lVar1 + (long)idxA * 8) + lVar12 * 4);
              (*out_rgba)[lVar11 * 4 + 2] =
                   *(float *)(*(long *)(lVar1 + (long)layer_names.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_ * 8) + lVar12 * 4);
              if ((int)layer_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage == -1) {
                (*out_rgba)[lVar11 * 4 + 3] = 1.0;
              }
              else {
                (*out_rgba)[lVar11 * 4 + 3] =
                     *(float *)(*(long *)(lVar1 + (long)(int)layer_names.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  * 8) + lVar12 * 4);
              }
            }
          }
        }
      }
    }
  }
  *width = (int)exr_image.images;
  *height = exr_image.images._4_4_;
  FreeEXRHeader((EXRHeader *)local_230);
  FreeEXRImage((EXRImage *)(exr_header.name + 0xf8));
  out_rgba_local._4_4_ = 0;
LAB_0098c901:
  ch_count._0_4_ = 1;
  std::vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>::~vector
            ((vector<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_> *)local_450);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&channels.
                super__Vector_base<tinyexr::LayerChannel,_std::allocator<tinyexr::LayerChannel>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  return out_rgba_local._4_4_;
}

Assistant:

int LoadEXRWithLayer(float **out_rgba, int *width, int *height,
                     const char *filename, const char *layername,
                     const char **err) {
  if (out_rgba == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXR()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      std::stringstream ss;
      ss << "Failed to open EXR file or read version info from EXR file. code("
         << ret << ")";
      tinyexr::SetErrorMessage(ss.str(), err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  // TODO: Probably limit loading to layers (channels) selected by layer index
  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      FreeEXRHeader(&exr_header);
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;

  std::vector<std::string> layer_names;
  tinyexr::GetLayers(exr_header, layer_names);

  std::vector<tinyexr::LayerChannel> channels;
  tinyexr::ChannelsInLayer(
      exr_header, layername == NULL ? "" : std::string(layername), channels);


  if (channels.size() < 1) {
    if (layername == NULL) {
      tinyexr::SetErrorMessage("Layer Not Found. Seems EXR contains channels with layer(e.g. `diffuse.R`). if you are using LoadEXR(), please try LoadEXRWithLayer(). LoadEXR() cannot load EXR having channels with layer.", err);

    } else {
      tinyexr::SetErrorMessage("Layer Not Found", err);
    }
    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
    return TINYEXR_ERROR_LAYER_NOT_FOUND;
  }

  size_t ch_count = channels.size() < 4 ? channels.size() : 4;
  for (size_t c = 0; c < ch_count; c++) {
    const tinyexr::LayerChannel &ch = channels[c];

    if (ch.name == "R") {
      idxR = int(ch.index);
    } else if (ch.name == "G") {
      idxG = int(ch.index);
    } else if (ch.name == "B") {
      idxB = int(ch.index);
    } else if (ch.name == "A") {
      idxA = int(ch.index);
    }
  }

  if (channels.size() == 1) {
    int chIdx = int(channels.front().index);
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
              static_cast<size_t>(exr_image.tiles[it].offset_x) * tile_size_x +
              i;
            const size_t jj =
              static_cast<size_t>(exr_image.tiles[it].offset_y) * tile_size_y +
              j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[chIdx][srcIdx];
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        const float val =
            reinterpret_cast<float **>(exr_image.images)[chIdx][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }
  } else {
    // Assume RGB(A)

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      FreeEXRHeader(&exr_header);
      FreeEXRImage(&exr_image);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));
    if (exr_header.tiled) {
      const size_t tile_size_x = static_cast<size_t>(exr_header.tile_size_x);
      const size_t tile_size_y = static_cast<size_t>(exr_header.tile_size_y);
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (size_t j = 0; j < tile_size_y; j++) {
          for (size_t i = 0; i < tile_size_x; i++) {
            const size_t ii =
                static_cast<size_t>(exr_image.tiles[it].offset_x) *
                    tile_size_x +
                i;
            const size_t jj =
                static_cast<size_t>(exr_image.tiles[it].offset_y) *
                    tile_size_y +
                j;
            const size_t idx = ii + jj * static_cast<size_t>(exr_image.width);

            // out of region check.
            if (ii >= static_cast<size_t>(exr_image.width)) {
              continue;
            }
            if (jj >= static_cast<size_t>(exr_image.height)) {
              continue;
            }
            const size_t srcIdx = i + j * tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
        }
      }
    } else {
      const size_t pixel_size = static_cast<size_t>(exr_image.width) *
        static_cast<size_t>(exr_image.height);
      for (size_t i = 0; i < pixel_size; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}